

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClassifier.h
# Opt level: O0

char16 __thiscall Js::CharClassifier::SkipBiDirectionalChars(CharClassifier *this,char16 **pszRef)

{
  bool bVar1;
  char16 **pszRef_local;
  CharClassifier *this_local;
  
  while( true ) {
    if (**pszRef == L'\0') {
      return L'\0';
    }
    bVar1 = IsBiDirectionalChar(this,(uint)(ushort)**pszRef);
    if (!bVar1) break;
    *pszRef = *pszRef + 1;
  }
  return **pszRef;
}

Assistant:

char16 SkipBiDirectionalChars(_In_z_ char16* &pszRef) const
        {
            while (*pszRef != '\0')
            {
                if (!IsBiDirectionalChar(*pszRef))
                {
                    return *pszRef;
                }

                pszRef++;
            }

            return '\0';
        }